

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall UI::renderUser(UI *this,User *user,int width,bool selected)

{
  bool bVar1;
  char *pcVar2;
  undefined1 in_CL;
  int in_EDX;
  long in_RSI;
  ImVec2 *in_RDI;
  ImVec2 symbol;
  ImVec2 p0;
  bool result;
  int npop;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar3;
  byte bVar4;
  int iVar5;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar6;
  
  uVar6 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  iVar5 = 0;
  uVar3 = (uint)in_stack_ffffffffffffffe0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12ee8e);
  ImGui::PushID((char *)CONCAT44(iVar5,uVar3));
  symbol = ImGui::GetCursorScreenPos();
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)in_EDX,1.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI
                       );
  if (bVar1) {
    uVar3 = CONCAT13(1,(int3)uVar3);
  }
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffffd0);
  if (((bVar1) || ((uVar6 & 0x1000000) != 0)) || ((*(byte *)(in_RSI + 5) & 1) != 0)) {
    ImGui::PushStyleColor((ImGuiCol)((ulong)in_RSI >> 0x20),(ImVec4 *)CONCAT44(in_EDX,uVar6));
    iVar5 = iVar5 + 1;
  }
  ImGui::SetCursorScreenPos((ImVec2 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
  ;
  renderOnlineIndicator
            ((UI *)CONCAT44(iVar5,uVar3),(char *)symbol,
             SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
  bVar4 = (byte)(uVar3 >> 0x18);
  ImGui::SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12ef58)
  ;
  ImGui::Text("%s",pcVar2);
  ImGui::PopStyleColor((int)in_stack_ffffffffffffffd4);
  ImGui::PopID();
  return (bool)(bVar4 & 1);
}

Assistant:

bool UI::renderUser(const User & user, int width, bool selected) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(user.username.c_str());
    const auto p0 = ImGui::GetCursorScreenPos();
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (ImGui::IsItemHovered() || selected || user.hasUnread) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.userActiveFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    renderOnlineIndicator("o", user.isOnline);
    ImGui::SameLine();
    ImGui::Text("%s", user.username.c_str());
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}